

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O1

void QIntC::IntConverter<int,_unsigned_int,_true,_false>::error(int i)

{
  ostream *poVar1;
  range_error *this;
  ostringstream msg;
  locale alStack_1b8 [8];
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::locale::classic();
  std::ios::imbue(alStack_1b8);
  std::locale::~locale(alStack_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"integer out of range converting ",0x20);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,i);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," from a ",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-byte signed type to a ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-byte unsigned type",0x13);
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::range_error::range_error(this,local_1b0);
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

static void
        error(From i)
        {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "integer out of range converting " << i << " from a " << sizeof(From)
                << "-byte signed type to a " << sizeof(To) << "-byte unsigned type";
            throw std::range_error(msg.str());
        }